

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

void __thiscall glu::Texture1DArray::upload(Texture1DArray *this)

{
  code *pcVar1;
  pointer pPVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TransferFormat TVar6;
  TestError *this_00;
  long lVar7;
  int levelNdx;
  ulong uVar8;
  long lVar9;
  ConstPixelBufferAccess access;
  long lVar5;
  
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  if (this->m_glTexture != 0) {
    (**(code **)(lVar5 + 0xb8))(0x8c18);
    pcVar1 = *(code **)(lVar5 + 0xff0);
    iVar3 = computePixelStore((TextureFormat *)&this->m_refTexture);
    (*pcVar1)(0xcf5,iVar3);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x1fe);
    TVar6 = getTransferFormat((this->m_refTexture).super_TextureLevelPyramid.m_format);
    lVar7 = 8;
    lVar9 = 0;
    uVar8 = 0;
    while( true ) {
      pPVar2 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(int)(((long)(this->m_refTexture).super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x28) <=
          (long)uVar8) break;
      if (*(long *)((long)&((this->m_refTexture).super_TextureLevelPyramid.m_data.
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7) != 0) {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&access,(ConstPixelBufferAccess *)
                           ((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8)
                  );
        (**(code **)(lVar5 + 0x1310))
                  (0x8c18,uVar8 & 0xffffffff,this->m_format,access.m_size.m_data[0],
                   access.m_size.m_data[1],0,TVar6,(ulong)TVar6 >> 0x20,access.m_data);
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x28;
      lVar7 = lVar7 + 0x10;
    }
    dVar4 = (**(code **)(lVar5 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x20c);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x1fb);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Texture1DArray::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_1D_ARRAY, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
	{
		if (m_refTexture.isLevelEmpty(levelNdx))
			continue; // Don't upload.

		tcu::ConstPixelBufferAccess access = m_refTexture.getLevel(levelNdx);
		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
		gl.texImage2D(GL_TEXTURE_1D_ARRAY, levelNdx, m_format, access.getWidth(), access.getHeight(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}